

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CheckInitialized(Message *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  Descriptor *this_00;
  string local_70;
  string_view local_50;
  byte local_29;
  LogMessage local_28;
  Voidify local_11;
  Message *local_10;
  Message *this_local;
  
  local_10 = this;
  bVar1 = protobuf::MessageLite::IsInitialized(&this->super_MessageLite);
  local_29 = 0;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/message.cc"
               ,0x92,"IsInitialized()");
    local_29 = 1;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [18])"Message of type \"");
    this_00 = GetDescriptor(this);
    local_50 = Descriptor::full_name(this_00);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,local_50);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [31])"\" is missing required fields: ");
    InitializationErrorString_abi_cxx11_(&local_70,this);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,&local_70);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar2);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_29 & 1) == 0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void Message::CheckInitialized() const {
  ABSL_CHECK(IsInitialized())
      << "Message of type \"" << GetDescriptor()->full_name()
      << "\" is missing required fields: " << InitializationErrorString();
}